

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::VerifyEcdsaAdaptor(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::VerifySignatureResponseStruct(cfd::js::api::VerifyEcdsaAdaptorRequestStruct_const&)>
  ::
  function<cfd::js::api::VerifySignatureResponseStruct(&)(cfd::js::api::VerifyEcdsaAdaptorRequestStruct_const&),void>
            ((function<cfd::js::api::VerifySignatureResponseStruct(cfd::js::api::VerifyEcdsaAdaptorRequestStruct_const&)>
              *)&local_38,SchnorrApi::VerifyEcdsaAdaptor);
  ExecuteJsonApi<cfd::js::api::json::VerifyEcdsaAdaptorRequest,cfd::js::api::json::VerifySignatureResponse,cfd::js::api::VerifyEcdsaAdaptorRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::VerifyEcdsaAdaptor(
    const std::string &request_message) {
  return ExecuteJsonApi<
      VerifyEcdsaAdaptorRequest, VerifySignatureResponse,
      VerifyEcdsaAdaptorRequestStruct, VerifySignatureResponseStruct>(
      request_message, SchnorrApi::VerifyEcdsaAdaptor);
}